

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O0

textblock * object_info_ego(ego_item *ego)

{
  textblock *ptVar1;
  textblock *result;
  size_t i;
  object known_obj;
  object obj;
  object_kind *kind;
  ego_item *ego_local;
  
  obj.note = 0;
  memcpy(&known_obj.note,&DAT_002a93e0,0x148);
  memcpy(&i,&DAT_002a9528,0x148);
  for (result = (textblock *)0x0;
      (result < (textblock *)(ulong)z_info->k_max &&
      ((obj.note = (quark_t)(k_info + (long)result), ((object_kind *)obj.note)->name == (char *)0x0
       || (result != (textblock *)(ulong)ego->poss_items->kidx))));
      result = (textblock *)((long)&result->text + 1)) {
  }
  known_obj.note = obj.note;
  ego_apply_magic((object *)&known_obj.note,L'\0',MINIMISE);
  object_copy((object *)&i,(object *)&known_obj.note);
  ptVar1 = object_info_out((object *)&known_obj.note,L'\x04');
  object_wipe((object *)&i);
  object_wipe((object *)&known_obj.note);
  return ptVar1;
}

Assistant:

textblock *object_info_ego(struct ego_item *ego)
{
	struct object_kind *kind = NULL;
	struct object obj = OBJECT_NULL, known_obj = OBJECT_NULL;
	size_t i;
	textblock *result;

	for (i = 0; i < z_info->k_max; i++) {
		kind = &k_info[i];
		if (!kind->name)
			continue;
		if (i == ego->poss_items->kidx)
			break;
	}

	obj.kind = kind;
	obj.tval = kind->tval;
	obj.sval = kind->sval;
	obj.ego = ego;
	ego_apply_magic(&obj, 0, MINIMISE);

	object_copy(&known_obj, &obj);
	obj.known = &known_obj;

	result = object_info_out(&obj, OINFO_NONE | OINFO_EGO);
	object_wipe(&known_obj);
	object_wipe(&obj);
	return result;
}